

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_bdd.c
# Opt level: O3

BDD sylvan_sat_single(BDD bdd,BDDSET vars)

{
  uint8_t *puVar1;
  ulong uVar2;
  uint uVar3;
  BDD low;
  MTBDD MVar4;
  BDD high;
  ulong uVar5;
  ulong vars_00;
  long lVar6;
  long lVar7;
  
  if (bdd != 0) {
    lVar6 = (vars & 0xffffffffff) * 0x10;
    puVar1 = nodes->data;
    vars_00 = vars & 0x8000000000000000 ^ *(ulong *)(puVar1 + lVar6) & 0x800000ffffffffff;
    uVar3 = (uint)(*(ulong *)(puVar1 + lVar6 + 8) >> 0x20);
    if (bdd == 0x8000000000000000) {
      bdd = 0x8000000000000000;
    }
    else {
      lVar7 = (bdd & 0xffffffffff) * 0x10;
      uVar2 = *(ulong *)(puVar1 + lVar7 + 8);
      if (uVar2 >> 0x28 == *(ulong *)(puVar1 + lVar6 + 8) >> 0x28) {
        uVar5 = *(ulong *)(puVar1 + lVar7) & 0x800000ffffffffff;
        if (uVar5 != (bdd & 0x8000000000000000)) {
          high = sylvan_sat_single(uVar5 ^ bdd & 0x8000000000000000,vars_00);
          if (high == 0) {
            return 0;
          }
          low = 0;
          goto LAB_0011be9c;
        }
        bdd = uVar2 & 0xffffffffff | uVar5;
      }
      else if ((uint)(uVar2 >> 0x28) <= uVar3 >> 8) {
        __assert_fail("bddnode_getvariable(n_bdd)>var",
                      "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/src/sylvan_bdd.c"
                      ,0x71a,"BDD sylvan_sat_single(BDD, BDDSET)");
      }
    }
    low = sylvan_sat_single(bdd,vars_00);
    if (low != 0) {
      high = 0;
LAB_0011be9c:
      MVar4 = _mtbdd_makenode(uVar3 >> 8,low,high);
      return MVar4;
    }
  }
  return 0;
}

Assistant:

BDD
sylvan_sat_single(BDD bdd, BDDSET vars)
{
    if (bdd == sylvan_false) return sylvan_false;
    if (sylvan_set_isempty(vars)) {
        assert(bdd == sylvan_true);
        return sylvan_true;
    }

    bddnode_t n_vars = MTBDD_GETNODE(vars);
    uint32_t var = bddnode_getvariable(n_vars);
    BDD next_vars = node_high(vars, n_vars);
    if (bdd == sylvan_true) {
        // take false
        BDD res = sylvan_sat_single(bdd, next_vars);
        return sylvan_makenode(var, res, sylvan_false);
    }
    bddnode_t n_bdd = MTBDD_GETNODE(bdd);
    if (bddnode_getvariable(n_bdd) != var) {
        assert(bddnode_getvariable(n_bdd)>var);
        // take false
        BDD res = sylvan_sat_single(bdd, next_vars);
        return sylvan_makenode(var, res, sylvan_false);
    }
    if (node_high(bdd, n_bdd) == sylvan_false) {
        // take false
        BDD res = sylvan_sat_single(node_low(bdd, n_bdd), next_vars);
        return sylvan_makenode(var, res, sylvan_false);
    }
    // take true
    BDD res = sylvan_sat_single(node_high(bdd, n_bdd), next_vars);
    return sylvan_makenode(var, sylvan_false, res);
}